

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

ByteString * __thiscall
SoftHSM::getECDHPubData(ByteString *__return_storage_ptr__,SoftHSM *this,ByteString *pubData)

{
  ulong uVar1;
  uchar uVar2;
  size_t sVar3;
  uchar *puVar4;
  byte *pbVar5;
  unsigned_long uVar6;
  ulong bytesLen;
  ByteString length;
  
  sVar3 = ByteString::size(pubData);
  if ((((0x21 < sVar3 - 0x20) || ((0x201000001U >> (sVar3 - 0x20 & 0x3f) & 1) == 0)) &&
      (sVar3 != 0x61)) &&
     (((sVar3 != 0x85 && (1 < sVar3)) &&
      (puVar4 = ByteString::operator[](pubData,0), *puVar4 == '\x04')))) {
    puVar4 = ByteString::operator[](pubData,1);
    uVar2 = *puVar4;
    pbVar5 = ByteString::operator[](pubData,1);
    if ((char)uVar2 < '\0') {
      bytesLen = (ulong)(*pbVar5 & 0x7f);
      uVar1 = bytesLen + 2;
      if (uVar1 < sVar3) {
        puVar4 = ByteString::operator[](pubData,2);
        ByteString::ByteString(&length,puVar4,bytesLen);
        uVar6 = ByteString::long_val(&length);
        ByteString::~ByteString(&length);
        if (uVar6 == sVar3 - uVar1) goto LAB_00147f90;
      }
    }
    else if (sVar3 - 2 == (ulong)*pbVar5) {
LAB_00147f90:
      ByteString::ByteString(__return_storage_ptr__,pubData);
      return __return_storage_ptr__;
    }
  }
  DERUTIL::raw2Octet(__return_storage_ptr__,pubData);
  return __return_storage_ptr__;
}

Assistant:

ByteString SoftHSM::getECDHPubData(ByteString& pubData)
{
	size_t len = pubData.size();
	size_t controlOctets = 2;
	if (len == 32 || len == 56 || len == 65 || len == 97 || len == 133)
	{
		// Raw: Length matches the public key size of:
		// EDDSA: X25519, X448
		// ECDSA: P-256, P-384, or P-521
		controlOctets = 0;
	}
	else if (len < controlOctets || pubData[0] != 0x04)
	{
		// Raw: Too short or does not start with 0x04
		controlOctets = 0;
	}
	else if (pubData[1] < 0x80)
	{
		// Raw: Length octet does not match remaining data length
		if (pubData[1] != (len - controlOctets)) controlOctets = 0;
	}
	else
	{
		size_t lengthOctets = pubData[1] & 0x7F;
		controlOctets += lengthOctets;

		if (controlOctets >= len)
		{
			// Raw: Too short
			controlOctets = 0;
		}
		else
		{
			ByteString length(&pubData[2], lengthOctets);

			if (length.long_val() != (len - controlOctets))
			{
				// Raw: Length octets does not match remaining data length
				controlOctets = 0;
			}
		}
	}

	// DER format
	if (controlOctets != 0) return pubData;

	return DERUTIL::raw2Octet(pubData);
}